

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

int ZSTD_seqToCodes(seqStore_t *seqStorePtr)

{
  ushort uVar1;
  seqDef *psVar2;
  BYTE *pBVar3;
  BYTE *pBVar4;
  BYTE *pBVar5;
  int iVar6;
  ZSTD_longLengthType_e ZVar7;
  BYTE BVar8;
  ulong uVar9;
  ulong uVar10;
  
  psVar2 = seqStorePtr->sequencesStart;
  uVar9 = (ulong)((long)seqStorePtr->sequences - (long)psVar2) >> 3;
  if ((uVar9 & 0xffffffff) <= seqStorePtr->maxNbSeq) {
    pBVar3 = seqStorePtr->llCode;
    pBVar4 = seqStorePtr->ofCode;
    pBVar5 = seqStorePtr->mlCode;
    for (uVar10 = 0; (uVar9 & 0xffffffff) != uVar10; uVar10 = uVar10 + 1) {
      uVar1 = psVar2[uVar10].litLength;
      if (uVar1 < 0x40) {
        BVar8 = ZSTD_LLcode_LL_Code[(uint)uVar1];
      }
      else {
        iVar6 = 0x1f;
        if (uVar1 != 0) {
          for (; uVar1 >> iVar6 == 0; iVar6 = iVar6 + -1) {
          }
        }
        BVar8 = '2' - ((byte)iVar6 ^ 0x1f);
      }
      iVar6 = 0x1f;
      if (psVar2[uVar10].offBase != 0) {
        for (; psVar2[uVar10].offBase >> iVar6 == 0; iVar6 = iVar6 + -1) {
        }
      }
      uVar1 = psVar2[uVar10].mlBase;
      pBVar3[uVar10] = BVar8;
      pBVar4[uVar10] = (BYTE)iVar6;
      if (uVar1 < 0x80) {
        BVar8 = (&ZSTD_MLcode_ML_Code)[(uint)uVar1];
      }
      else {
        iVar6 = 0x1f;
        if (uVar1 != 0) {
          for (; uVar1 >> iVar6 == 0; iVar6 = iVar6 + -1) {
          }
        }
        BVar8 = 'C' - ((byte)iVar6 ^ 0x1f);
      }
      pBVar5[uVar10] = BVar8;
    }
    ZVar7 = seqStorePtr->longLengthType;
    if (ZVar7 == ZSTD_llt_literalLength) {
      pBVar3[seqStorePtr->longLengthPos] = '#';
      ZVar7 = seqStorePtr->longLengthType;
    }
    if (ZVar7 == ZSTD_llt_matchLength) {
      pBVar5[seqStorePtr->longLengthPos] = '4';
    }
    return 0;
  }
  __assert_fail("nbSeq <= seqStorePtr->maxNbSeq",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                ,0x5b0e,"int ZSTD_seqToCodes(const seqStore_t *)");
}

Assistant:

int ZSTD_seqToCodes(const seqStore_t* seqStorePtr)
{
    const seqDef* const sequences = seqStorePtr->sequencesStart;
    BYTE* const llCodeTable = seqStorePtr->llCode;
    BYTE* const ofCodeTable = seqStorePtr->ofCode;
    BYTE* const mlCodeTable = seqStorePtr->mlCode;
    U32 const nbSeq = (U32)(seqStorePtr->sequences - seqStorePtr->sequencesStart);
    U32 u;
    int longOffsets = 0;
    assert(nbSeq <= seqStorePtr->maxNbSeq);
    for (u=0; u<nbSeq; u++) {
        U32 const llv = sequences[u].litLength;
        U32 const ofCode = ZSTD_highbit32(sequences[u].offBase);
        U32 const mlv = sequences[u].mlBase;
        llCodeTable[u] = (BYTE)ZSTD_LLcode(llv);
        ofCodeTable[u] = (BYTE)ofCode;
        mlCodeTable[u] = (BYTE)ZSTD_MLcode(mlv);
        assert(!(MEM_64bits() && ofCode >= STREAM_ACCUMULATOR_MIN));
        if (MEM_32bits() && ofCode >= STREAM_ACCUMULATOR_MIN)
            longOffsets = 1;
    }
    if (seqStorePtr->longLengthType==ZSTD_llt_literalLength)
        llCodeTable[seqStorePtr->longLengthPos] = MaxLL;
    if (seqStorePtr->longLengthType==ZSTD_llt_matchLength)
        mlCodeTable[seqStorePtr->longLengthPos] = MaxML;
    return longOffsets;
}